

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::DecodePsbtRequest::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest> *in_stack_fffffffffffffc88;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest> *in_stack_fffffffffffffc90;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest> *this;
  char (*in_stack_fffffffffffffc98) [10];
  char (*__args) [10];
  function<void_(cfd::api::json::DecodePsbtRequest_&,_const_UniValue_&)> *in_stack_fffffffffffffca0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest> local_2c9;
  allocator local_231;
  value_type local_230;
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
                   *)0x6adc43);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtRequest_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtRequest_ptr
                *)in_stack_fffffffffffffc98);
    std::function<void(cfd::api::json::DecodePsbtRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,
               (_func_void_DecodePsbtRequest_ptr_UniValue_ptr *)in_stack_fffffffffffffc98);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc98);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
                        *)in_stack_fffffffffffffca0,(char (*) [5])in_stack_fffffffffffffc98,
                       in_stack_fffffffffffffc90);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"psbt",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtRequest_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtRequest_ptr
                *)in_stack_fffffffffffffc98);
    std::function<void(cfd::api::json::DecodePsbtRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,
               (_func_void_DecodePsbtRequest_ptr_UniValue_ptr *)in_stack_fffffffffffffc98);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc98);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
                        *)in_stack_fffffffffffffca0,(char (*) [8])in_stack_fffffffffffffc98,
                       in_stack_fffffffffffffc90);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"network",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtRequest_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtRequest_ptr
                *)in_stack_fffffffffffffc98);
    std::function<void(cfd::api::json::DecodePsbtRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,
               (_func_void_DecodePsbtRequest_ptr_UniValue_ptr *)in_stack_fffffffffffffc98);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc98);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>_>_>_>
                        *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                       in_stack_fffffffffffffc90);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"hasDetail",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    __args = (char (*) [10])((long)&local_2c9.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtRequest_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtRequest_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtRequest_ptr
                *)__args);
    std::function<void(cfd::api::json::DecodePsbtRequest&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtRequest&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,(_func_void_DecodePsbtRequest_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>&>
                      (this_00,__args,in_stack_fffffffffffffc90);
    local_2c9.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_2c9.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_2c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_2c9.get_function.super__Function_base._M_functor._M_pod_data + 1),
               "hasSimple",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_2c9.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_2c9.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtRequest>::~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void DecodePsbtRequest::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<DecodePsbtRequest> func_table;  // NOLINT

  func_table = {
    DecodePsbtRequest::GetPsbtString,
    DecodePsbtRequest::SetPsbtString,
    DecodePsbtRequest::GetPsbtFieldType,
  };
  json_mapper.emplace("psbt", func_table);
  item_list.push_back("psbt");
  func_table = {
    DecodePsbtRequest::GetNetworkString,
    DecodePsbtRequest::SetNetworkString,
    DecodePsbtRequest::GetNetworkFieldType,
  };
  json_mapper.emplace("network", func_table);
  item_list.push_back("network");
  func_table = {
    DecodePsbtRequest::GetHasDetailString,
    DecodePsbtRequest::SetHasDetailString,
    DecodePsbtRequest::GetHasDetailFieldType,
  };
  json_mapper.emplace("hasDetail", func_table);
  item_list.push_back("hasDetail");
  func_table = {
    DecodePsbtRequest::GetHasSimpleString,
    DecodePsbtRequest::SetHasSimpleString,
    DecodePsbtRequest::GetHasSimpleFieldType,
  };
  json_mapper.emplace("hasSimple", func_table);
  item_list.push_back("hasSimple");
}